

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

LR des_FP(LR lr)

{
  uint32_t uVar1;
  LR local_18;
  LR lr_local;
  
  local_18.L = lr.L;
  uVar1 = local_18.L;
  local_18 = lr;
  uVar1 = rol(uVar1,1);
  local_18.L = uVar1;
  uVar1 = rol(local_18.R,1);
  local_18.R = uVar1;
  des_bitswap_IP_FP(&local_18.R,&local_18.L,1,0x55555555);
  des_bitswap_IP_FP(&local_18.L,&local_18.R,8,0xff00ff);
  des_bitswap_IP_FP(&local_18.L,&local_18.R,2,0x33333333);
  des_bitswap_IP_FP(&local_18.R,&local_18.L,0x10,0xffff);
  des_bitswap_IP_FP(&local_18.R,&local_18.L,4,0xf0f0f0f);
  return local_18;
}

Assistant:

static inline LR des_FP(LR lr)
{
    lr.L = rol(lr.L, 1);
    lr.R = rol(lr.R, 1);

    des_bitswap_IP_FP(&lr.R, &lr.L,  1, 0x55555555);
    des_bitswap_IP_FP(&lr.L, &lr.R,  8, 0x00FF00FF);
    des_bitswap_IP_FP(&lr.L, &lr.R,  2, 0x33333333);
    des_bitswap_IP_FP(&lr.R, &lr.L, 16, 0x0000FFFF);
    des_bitswap_IP_FP(&lr.R, &lr.L,  4, 0x0F0F0F0F);

    return lr;
}